

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

void __thiscall
Js::JavascriptMap::MarkVisitKindSpecificPtrs(JavascriptMap *this,SnapshotExtractor *extractor)

{
  Type TVar1;
  bool bVar2;
  void **ppvVar3;
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  Iterator iterator;
  SnapshotExtractor *extractor_local;
  JavascriptMap *this_local;
  
  iterator.current.ptr =
       (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)extractor;
  GetIterator((JavascriptMap *)&stack0xffffffffffffffd8);
  while( true ) {
    bVar2 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            ::Iterator::Next((Iterator *)&stack0xffffffffffffffd8);
    TVar1 = iterator.current;
    if (!bVar2) break;
    MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
    ::Iterator::Current((Iterator *)&stack0xffffffffffffffd8);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               local_30);
    ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)local_30);
    TTD::SnapshotExtractor::MarkVisitVar((SnapshotExtractor *)TVar1.ptr,*ppvVar3);
    TVar1 = iterator.current;
    MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
    ::Iterator::Current((Iterator *)&stack0xffffffffffffffd8);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               local_38);
    ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)local_38);
    TTD::SnapshotExtractor::MarkVisitVar((SnapshotExtractor *)TVar1.ptr,*ppvVar3);
  }
  return;
}

Assistant:

void JavascriptMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    auto iterator = GetIterator();
    while(iterator.Next())
    {
        extractor->MarkVisitVar(iterator.Current().Key());
        extractor->MarkVisitVar(iterator.Current().Value());
    }
}